

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall vm::VM::Tcmp<int>(VM *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  ensureStackUsed(this,1);
  iVar1 = this->_sp;
  this->_sp = iVar1 + -1;
  iVar1 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar1 + -1];
  ensureStackUsed(this,1);
  iVar2 = this->_sp;
  this->_sp = iVar2 + -1;
  iVar2 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar2 + -1];
  if (iVar1 < iVar2) {
    ensureStackRest(this,1);
    iVar1 = this->_sp;
    this->_sp = iVar1 + 1;
    (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[iVar1] = 1;
  }
  else {
    ensureStackRest(this,1);
    iVar3 = this->_sp;
    this->_sp = iVar3 + 1;
    piVar4 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    if (iVar2 < iVar1) {
      piVar4[iVar3] = -1;
    }
    else {
      piVar4[iVar3] = 0;
    }
  }
  return;
}

Assistant:

void VM::Tcmp() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    if constexpr (std::is_floating_point_v<T>) {
        if (std::isnan(lhs) || std::isnan(rhs)) {
            PUSH(0);
            return;
        }
        else if (std::isinf(lhs) && std::isinf(rhs) && lhs * rhs > 0) {
            PUSH(0);
            return;
        }
    }
    if (lhs > rhs) {
        PUSH(1);
    }
    else if (lhs < rhs) {
        PUSH(-1);
    }
    else {
        PUSH(0);
    }
}